

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O2

void printrowsz(int vulnerability_id,FILE *finx,longlong size,longlong uncompressedSize)

{
  pointer puVar1;
  uint uVar2;
  ulong uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> uncompressedBuffer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressedBuffer;
  uLongf destLen;
  
  compressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  compressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  compressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&compressedBuffer,size + 1);
  uncompressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uncompressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uncompressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&uncompressedBuffer,uncompressedSize);
  fread(compressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start,size,1,(FILE *)finx);
  destLen = (long)uncompressedBuffer.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)uncompressedBuffer.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  uVar2 = uncompress(uncompressedBuffer.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,&destLen,
                     compressedBuffer.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,size);
  puVar1 = uncompressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar2 == 0) {
    for (uVar3 = 0; uVar3 < (ulong)uncompressedSize; uVar3 = uVar3 + 0xc) {
      printf("%d, %d, %d, %.10e\n",SUB84((double)*(float *)(puVar1 + uVar3 + 8),0),vulnerability_id,
             (ulong)*(uint *)(puVar1 + uVar3),(ulong)*(uint *)(puVar1 + uVar3 + 4));
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&uncompressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              );
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&compressedBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  fprintf(_stderr,"FATAL: Got bad return code from uncompress %d\n",(ulong)uVar2);
  exit(1);
}

Assistant:

inline void printrowsz(int vulnerability_id, FILE *finx, long long size,
		       long long uncompressedSize) {

	uLongf i = 0;
	std::vector<unsigned char> compressedBuffer;
	compressedBuffer.resize(size + 1);

	std::vector<unsigned char> uncompressedBuffer;
	uncompressedBuffer.resize(uncompressedSize);

	fread(&compressedBuffer[0], size, 1, finx);
	uLongf destLen = (uLongf)uncompressedBuffer.size();
	int ret = uncompress(&uncompressedBuffer[0], &destLen,
			     &compressedBuffer[0], size);
	if (ret != Z_OK) {
		fprintf(stderr, "FATAL: Got bad return code from uncompress %d\n", ret);
		exit(EXIT_FAILURE);
	}

	VulnerabilityRow *row = (VulnerabilityRow*)&uncompressedBuffer[0];
	while (i < uncompressedSize) {
		printf("%d, %d, %d, %.10e\n", vulnerability_id,
		       row->intensity_bin_id, row->damage_bin_id,
		       row->probability);
		row++;
		i += sizeof(VulnerabilityRow);
	}

}